

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cmFileAPI::GetConfigureLogVersions
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          cmFileAPI *this)

{
  pointer pOVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  pointer puVar4;
  unsigned_long uVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  pointer puVar9;
  pointer puVar10;
  unsigned_long uVar11;
  unsigned_long *puVar12;
  const_iterator __end2;
  _Base_ptr *__args;
  _Base_ptr p_Var13;
  const_iterator __end2_1;
  pointer pOVar14;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar14 = (this->TopQuery).Known.
            super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar1 = (this->TopQuery).Known.
           super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar14 != pOVar1) {
    puVar12 = &pOVar14->Version;
    do {
      if (((Object *)(puVar12 + -1))->Kind == ConfigureLog) {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                     iVar2,puVar12);
        }
        else {
          *iVar2._M_current = *puVar12;
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      pOVar14 = (pointer)(puVar12 + 1);
      puVar12 = puVar12 + 2;
    } while (pOVar14 != pOVar1);
  }
  for (p_Var7 = (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->ClientQueries)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    p_Var3 = p_Var7[2]._M_parent;
    if (*(_Base_ptr *)(p_Var7 + 2) != p_Var3) {
      __args = &(*(_Base_ptr *)(p_Var7 + 2))->_M_parent;
      do {
        if (((_Rb_tree_node_base *)(__args + -1))->_M_color == _S_black) {
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__
                       ,iVar2,(unsigned_long *)__args);
          }
          else {
            *iVar2._M_current = (unsigned_long)*__args;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
        p_Var13 = (_Base_ptr)(__args + 1);
        __args = __args + 2;
      } while (p_Var13 != p_Var3);
    }
  }
  puVar9 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar9 != puVar4) {
    uVar8 = (long)puVar4 - (long)puVar9 >> 3;
    lVar6 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar9,puVar4,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar9,puVar4);
    puVar9 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar9 != puVar4) {
      puVar12 = puVar9 + 1;
      do {
        puVar9 = puVar12;
        if (puVar9 == puVar4) {
          return __return_storage_ptr__;
        }
        puVar12 = puVar9 + 1;
      } while (puVar9[-1] != *puVar9);
      puVar10 = puVar9 + -1;
      uVar11 = puVar9[-1];
      for (; puVar12 != puVar4; puVar12 = puVar12 + 1) {
        uVar5 = *puVar12;
        if (uVar11 != uVar5) {
          puVar10[1] = uVar5;
          puVar10 = puVar10 + 1;
        }
        uVar11 = uVar5;
      }
      if (puVar10 + 1 != puVar4) {
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = puVar10 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned long> cmFileAPI::GetConfigureLogVersions()
{
  std::vector<unsigned long> versions;
  auto getConfigureLogVersions = [&versions](Query const& q) {
    for (Object const& o : q.Known) {
      if (o.Kind == ObjectKind::ConfigureLog) {
        versions.emplace_back(o.Version);
      }
    }
  };
  getConfigureLogVersions(this->TopQuery);
  for (auto const& client : this->ClientQueries) {
    getConfigureLogVersions(client.second.DirQuery);
  }
  std::sort(versions.begin(), versions.end());
  versions.erase(std::unique(versions.begin(), versions.end()),
                 versions.end());
  return versions;
}